

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Mio_LibraryMultiArea(Mio_Library_t *pLib,double Multi)

{
  Mio_Gate_t *pGate;
  double dVar1;
  
  for (pGate = Mio_LibraryReadGates(pLib); pGate != (Mio_Gate_t *)0x0;
      pGate = Mio_GateReadNext(pGate)) {
    if (1 < pGate->nInputs) {
      dVar1 = pow((double)pGate->nInputs,Multi);
      pGate->dArea = dVar1 * pGate->dArea;
    }
  }
  return;
}

Assistant:

void Mio_LibraryMultiArea( Mio_Library_t * pLib, double Multi )
{
    Mio_Gate_t * pGate;
    Mio_LibraryForEachGate( pLib, pGate )
    {
        if ( pGate->nInputs < 2 )
            continue;
//        printf( "Before %8.3f  ", pGate->dArea );
        pGate->dArea *= pow( pGate->nInputs, Multi );
//        printf( "After %8.3f  Inputs = %d. Factor = %8.3f\n", pGate->dArea, pGate->nInputs, pow( pGate->nInputs, Multi ) );
    }
}